

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

GCstr * lj_parse_keepstr(LexState *ls,char *str,size_t len)

{
  lua_State *L_00;
  GCstr *key;
  TValue *pTVar1;
  TValue *tv;
  GCstr *s;
  lua_State *L;
  size_t len_local;
  char *str_local;
  LexState *ls_local;
  
  L_00 = ls->L;
  key = lj_str_new(L_00,str,len);
  pTVar1 = lj_tab_setstr(L_00,ls->fs->kt,key);
  if (pTVar1->u64 == 0xffffffffffffffff) {
    pTVar1->u64 = 0xfffeffffffffffff;
  }
  if (*(ulong *)((L_00->glref).ptr64 + 0x18) <= *(ulong *)((L_00->glref).ptr64 + 0x10)) {
    lj_gc_step(L_00);
  }
  return key;
}

Assistant:

GCstr *lj_parse_keepstr(LexState *ls, const char *str, size_t len)
{
  /* NOBARRIER: the key is new or kept alive. */
  lua_State *L = ls->L;
  GCstr *s = lj_str_new(L, str, len);
  TValue *tv = lj_tab_setstr(L, ls->fs->kt, s);
  if (tvisnil(tv)) setboolV(tv, 1);
  lj_gc_check(L);
  return s;
}